

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlschemas(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xmlschemas : 16 of 27 functions ...\n");
  }
  iVar1 = test_xmlSchemaDump();
  iVar2 = test_xmlSchemaGetParserErrors();
  iVar3 = test_xmlSchemaGetValidErrors();
  iVar4 = test_xmlSchemaIsValid();
  iVar5 = test_xmlSchemaNewDocParserCtxt();
  iVar6 = test_xmlSchemaNewMemParserCtxt();
  iVar7 = test_xmlSchemaNewParserCtxt();
  iVar8 = test_xmlSchemaNewValidCtxt();
  iVar9 = test_xmlSchemaParse();
  iVar10 = test_xmlSchemaSAXPlug();
  iVar11 = test_xmlSchemaSAXUnplug();
  iVar12 = test_xmlSchemaSetParserErrors();
  iVar13 = test_xmlSchemaSetParserStructuredErrors();
  iVar14 = test_xmlSchemaSetValidErrors();
  iVar15 = test_xmlSchemaSetValidOptions();
  iVar16 = test_xmlSchemaSetValidStructuredErrors();
  iVar17 = test_xmlSchemaValidCtxtGetOptions();
  iVar18 = test_xmlSchemaValidCtxtGetParserCtxt();
  iVar19 = test_xmlSchemaValidateDoc();
  iVar20 = test_xmlSchemaValidateFile();
  iVar21 = test_xmlSchemaValidateOneElement();
  iVar22 = test_xmlSchemaValidateSetFilename();
  iVar23 = test_xmlSchemaValidateSetLocator();
  iVar24 = test_xmlSchemaValidateStream();
  uVar25 = iVar24 + iVar23 + iVar22 + iVar21 + iVar20 + iVar19 + iVar18 + iVar17 + iVar16 + iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar25 != 0) {
    printf("Module xmlschemas: %d errors\n",(ulong)uVar25);
  }
  return uVar25;
}

Assistant:

static int
test_xmlschemas(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlschemas : 16 of 27 functions ...\n");
    test_ret += test_xmlSchemaDump();
    test_ret += test_xmlSchemaGetParserErrors();
    test_ret += test_xmlSchemaGetValidErrors();
    test_ret += test_xmlSchemaIsValid();
    test_ret += test_xmlSchemaNewDocParserCtxt();
    test_ret += test_xmlSchemaNewMemParserCtxt();
    test_ret += test_xmlSchemaNewParserCtxt();
    test_ret += test_xmlSchemaNewValidCtxt();
    test_ret += test_xmlSchemaParse();
    test_ret += test_xmlSchemaSAXPlug();
    test_ret += test_xmlSchemaSAXUnplug();
    test_ret += test_xmlSchemaSetParserErrors();
    test_ret += test_xmlSchemaSetParserStructuredErrors();
    test_ret += test_xmlSchemaSetValidErrors();
    test_ret += test_xmlSchemaSetValidOptions();
    test_ret += test_xmlSchemaSetValidStructuredErrors();
    test_ret += test_xmlSchemaValidCtxtGetOptions();
    test_ret += test_xmlSchemaValidCtxtGetParserCtxt();
    test_ret += test_xmlSchemaValidateDoc();
    test_ret += test_xmlSchemaValidateFile();
    test_ret += test_xmlSchemaValidateOneElement();
    test_ret += test_xmlSchemaValidateSetFilename();
    test_ret += test_xmlSchemaValidateSetLocator();
    test_ret += test_xmlSchemaValidateStream();

    if (test_ret != 0)
	printf("Module xmlschemas: %d errors\n", test_ret);
    return(test_ret);
}